

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_Size(FT_Face face,FT_Size *asize)

{
  FT_Driver_Class pFVar1;
  FT_Memory memory_00;
  FT_Size P;
  FT_Size_Internal pFVar2;
  FT_Size_Internal internal;
  FT_ListNode node;
  FT_Size size;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_Memory memory;
  FT_Size *ppFStack_20;
  FT_Error error;
  FT_Size *asize_local;
  FT_Face face_local;
  
  internal = (FT_Size_Internal)0x0;
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (asize == (FT_Size *)0x0) {
    face_local._4_4_ = 6;
  }
  else if (face->driver == (FT_Driver)0x0) {
    face_local._4_4_ = 0x22;
  }
  else {
    *asize = (FT_Size)0x0;
    pFVar1 = face->driver->clazz;
    memory_00 = face->memory;
    ppFStack_20 = asize;
    asize_local = (FT_Size *)face;
    P = (FT_Size)ft_mem_alloc(memory_00,pFVar1->size_object_size,(FT_Error *)((long)&memory + 4));
    if ((memory._4_4_ == 0) &&
       (internal = (FT_Size_Internal)ft_mem_alloc(memory_00,0x18,(FT_Error *)((long)&memory + 4)),
       memory._4_4_ == 0)) {
      P->face = (FT_Face)asize_local;
      pFVar2 = (FT_Size_Internal)ft_mem_alloc(memory_00,0x48,(FT_Error *)((long)&memory + 4));
      if (memory._4_4_ == 0) {
        P->internal = pFVar2;
        if (pFVar1->init_size != (FT_Size_InitFunc)0x0) {
          memory._4_4_ = (*pFVar1->init_size)(P);
        }
        if (memory._4_4_ == 0) {
          *ppFStack_20 = P;
          *(FT_Size *)&internal->autohint_metrics = P;
          FT_List_Add((FT_List)(asize_local + 0x19),(FT_ListNode)internal);
        }
      }
    }
    if (memory._4_4_ != 0) {
      ft_mem_free(memory_00,internal);
      ft_mem_free(memory_00,P);
    }
    face_local._4_4_ = memory._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Size( FT_Face   face,
               FT_Size  *asize )
  {
    FT_Error         error;
    FT_Memory        memory;
    FT_Driver        driver;
    FT_Driver_Class  clazz;

    FT_Size          size = NULL;
    FT_ListNode      node = NULL;

    FT_Size_Internal  internal = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !asize )
      return FT_THROW( Invalid_Argument );

    if ( !face->driver )
      return FT_THROW( Invalid_Driver_Handle );

    *asize = NULL;

    driver = face->driver;
    clazz  = driver->clazz;
    memory = face->memory;

    /* Allocate new size object and perform basic initialisation */
    if ( FT_ALLOC( size, clazz->size_object_size ) || FT_NEW( node ) )
      goto Exit;

    size->face = face;

    if ( FT_NEW( internal ) )
      goto Exit;

    size->internal = internal;

    if ( clazz->init_size )
      error = clazz->init_size( size );

    /* in case of success, add to the face's list */
    if ( !error )
    {
      *asize     = size;
      node->data = size;
      FT_List_Add( &face->sizes_list, node );
    }

  Exit:
    if ( error )
    {
      FT_FREE( node );
      FT_FREE( size );
    }

    return error;
  }